

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointWriter::WriteEntry
          (CheckpointWriter *this,CatalogEntry *entry,Serializer *serializer)

{
  CatalogType CVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  InternalException *this_00;
  TableCatalogEntry *table;
  allocator local_41;
  string local_40;
  
  Serializer::WriteProperty<duckdb::CatalogType>(serializer,99,"catalog_type",&entry->type);
  CVar1 = entry->type;
  switch(CVar1) {
  case TABLE_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[7];
    break;
  case SCHEMA_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[6];
    break;
  case VIEW_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[8];
    break;
  case INDEX_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[0xc];
    break;
  case PREPARED_STATEMENT:
  case COLLATION_ENTRY:
switchD_01ac1e3a_caseD_5:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unrecognized catalog type in CheckpointWriter::WriteEntry",
               &local_41);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case SEQUENCE_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[9];
    break;
  case TYPE_ENTRY:
    UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[0xd];
    break;
  default:
    if (CVar1 == MACRO_ENTRY) {
      UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[10];
    }
    else {
      if (CVar1 != TABLE_MACRO_ENTRY) goto switchD_01ac1e3a_caseD_5;
      UNRECOVERED_JUMPTABLE = this->_vptr_CheckpointWriter[0xb];
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,entry,serializer);
  return;
}

Assistant:

void CheckpointWriter::WriteEntry(CatalogEntry &entry, Serializer &serializer) {
	serializer.WriteProperty(99, "catalog_type", entry.type);

	switch (entry.type) {
	case CatalogType::SCHEMA_ENTRY: {
		auto &schema = entry.Cast<SchemaCatalogEntry>();
		WriteSchema(schema, serializer);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		auto &custom_type = entry.Cast<TypeCatalogEntry>();
		WriteType(custom_type, serializer);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		auto &seq = entry.Cast<SequenceCatalogEntry>();
		WriteSequence(seq, serializer);
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		auto &table = entry.Cast<TableCatalogEntry>();
		WriteTable(table, serializer);
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		auto &view = entry.Cast<ViewCatalogEntry>();
		WriteView(view, serializer);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		auto &macro = entry.Cast<ScalarMacroCatalogEntry>();
		WriteMacro(macro, serializer);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		auto &macro = entry.Cast<TableMacroCatalogEntry>();
		WriteTableMacro(macro, serializer);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		auto &index = entry.Cast<IndexCatalogEntry>();
		WriteIndex(index, serializer);
		break;
	}
	default:
		throw InternalException("Unrecognized catalog type in CheckpointWriter::WriteEntry");
	}
}